

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

CompressionFunction * duckdb::GetRLEFunction<duckdb::hugeint_t,true>(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_RLE;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = RLEInitAnalyze<duckdb::hugeint_t>;
  in_RDI->analyze = RLEAnalyze<duckdb::hugeint_t>;
  in_RDI->final_analyze = RLEFinalAnalyze<duckdb::hugeint_t>;
  in_RDI->init_compression = RLEInitCompression<duckdb::hugeint_t,true>;
  in_RDI->compress = RLECompress<duckdb::hugeint_t,true>;
  in_RDI->compress_finalize = RLEFinalizeCompress<duckdb::hugeint_t,true>;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = RLEInitScan<duckdb::hugeint_t>;
  in_RDI->scan_vector = RLEScan<duckdb::hugeint_t>;
  in_RDI->scan_partial = RLEScanPartial<duckdb::hugeint_t>;
  in_RDI->select = RLESelect<duckdb::hugeint_t>;
  in_RDI->filter = RLEFilter<duckdb::hugeint_t>;
  in_RDI->fetch_row = RLEFetchRow<duckdb::hugeint_t>;
  in_RDI->skip = RLESkip<duckdb::hugeint_t>;
  in_RDI->init_segment = (compression_init_segment_t)0x0;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  *(undefined8 *)((long)&in_RDI->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&in_RDI->get_segment_info + 1) = 0;
  return in_RDI;
}

Assistant:

CompressionFunction GetRLEFunction(PhysicalType data_type) {
	return CompressionFunction(CompressionType::COMPRESSION_RLE, data_type, RLEInitAnalyze<T>, RLEAnalyze<T>,
	                           RLEFinalAnalyze<T>, RLEInitCompression<T, WRITE_STATISTICS>,
	                           RLECompress<T, WRITE_STATISTICS>, RLEFinalizeCompress<T, WRITE_STATISTICS>,
	                           RLEInitScan<T>, RLEScan<T>, RLEScanPartial<T>, RLEFetchRow<T>, RLESkip<T>, nullptr,
	                           nullptr, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr, RLESelect<T>,
	                           RLEFilter<T>);
}